

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polynomial.h
# Opt level: O0

Polynomial<double> gmath::d<double>(Polynomial<double> *p)

{
  int iVar1;
  double *extraout_RDX;
  Polynomial<double> *in_RSI;
  Polynomial<double> *in_RDI;
  Polynomial<double> PVar2;
  int i;
  Polynomial<double> *ret;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  undefined4 in_stack_ffffffffffffffc0;
  int iVar3;
  Polynomial<double> *this;
  undefined4 local_18;
  
  this = in_RDI;
  Polynomial<double>::Polynomial
            ((Polynomial<double> *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  local_18 = 1;
  while (iVar3 = local_18, iVar1 = Polynomial<double>::getDegree(in_RSI), iVar3 <= iVar1) {
    Polynomial<double>::operator[](in_RSI,local_18);
    Polynomial<double>::set
              (this,(int)((ulong)in_RDI >> 0x20),(double)CONCAT44(iVar3,in_stack_ffffffffffffffc0));
    local_18 = local_18 + 1;
  }
  PVar2.c = extraout_RDX;
  PVar2._0_8_ = this;
  return PVar2;
}

Assistant:

inline Polynomial<T> d(const Polynomial<T> &p)
{
  Polynomial<T> ret;

  for (int i=1; i<=p.getDegree(); i++)
  {
    ret.set(i-1, i*p[i]);
  }

  return ret;
}